

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalArrowCollector::GetGlobalSinkState
          (PhysicalArrowCollector *this,ClientContext *context)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0xb8);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 1) = 1;
  *(undefined1 *)(pp_Var1 + 10) = 0;
  *pp_Var1 = (_func_int *)&PTR__ArrowCollectorGlobalState_02463e18;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)0x0;
  pp_Var1[0xf] = (_func_int *)0x0;
  pp_Var1[0x10] = (_func_int *)0x0;
  pp_Var1[0x11] = (_func_int *)0x0;
  pp_Var1[0x12] = (_func_int *)0x0;
  pp_Var1[0x13] = (_func_int *)0x0;
  pp_Var1[0x14] = (_func_int *)0x0;
  pp_Var1[0x15] = (_func_int *)0x0;
  pp_Var1[0x16] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalArrowCollector::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<ArrowCollectorGlobalState>();
}